

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_pea_32_pcdi(void)

{
  uint value;
  uint ea;
  
  value = m68ki_get_ea_pcdi();
  m68ki_push_32(value);
  return;
}

Assistant:

static void m68k_op_pea_32_pcdi(void)
{
	uint ea = EA_PCDI_32();

	m68ki_push_32(ea);
}